

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::reallocate
          (QMovableArrayOps<QModelIndex> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QModelIndex>_*,_QModelIndex_*> pVar2;
  pair<QTypedArrayData<QModelIndex>_*,_QModelIndex_*> pair;
  QModelIndex *pQStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QModelIndex>::reallocateUnaligned
                    ((QTypedArrayData<QModelIndex> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  qt_noop();
  *(QTypedArrayData<QModelIndex> **)in_RDI = pVar2.first;
  pQStack_10 = pVar2.second;
  in_RDI->i = (quintptr)pQStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }